

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::TracingServiceState_Producer::Serialize
          (TracingServiceState_Producer *this,Message *msg)

{
  uint8_t *src_begin;
  
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 2) != 0) {
    protozero::Message::AppendVarInt<int>(msg,1,this->id_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 4) != 0) {
    protozero::Message::AppendBytes
              (msg,2,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x20) != 0) {
    protozero::Message::AppendVarInt<int>(msg,5,this->pid_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 8) != 0) {
    protozero::Message::AppendVarInt<int>(msg,3,this->uid_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x10) != 0) {
    protozero::Message::AppendBytes
              (msg,4,(this->sdk_version_)._M_dataplus._M_p,(this->sdk_version_)._M_string_length);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void TracingServiceState_Producer::Serialize(::protozero::Message* msg) const {
  // Field 1: id
  if (_has_field_[1]) {
    msg->AppendVarInt(1, id_);
  }

  // Field 2: name
  if (_has_field_[2]) {
    msg->AppendString(2, name_);
  }

  // Field 5: pid
  if (_has_field_[5]) {
    msg->AppendVarInt(5, pid_);
  }

  // Field 3: uid
  if (_has_field_[3]) {
    msg->AppendVarInt(3, uid_);
  }

  // Field 4: sdk_version
  if (_has_field_[4]) {
    msg->AppendString(4, sdk_version_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}